

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O0

int __thiscall CVmFormatter::get_buffer_maxcol(CVmFormatter *this)

{
  long in_RDI;
  undefined4 local_4;
  
  if ((*(ushort *)(in_RDI + 0xef81) >> 8 & 1) == 0) {
    local_4 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
  }
  else {
    local_4 = 0x800;
  }
  return local_4;
}

Assistant:

virtual int get_buffer_maxcol() const
    {
        /* 
         *   if the OS is doing the line wrapping, use the full buffer;
         *   otherwise, use the actual line width from the underyling
         *   console 
         */
        if (os_line_wrap_)
            return OS_MAXWIDTH;
        else
            return console_->get_line_width();
    }